

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::Material::operator==(Material *this,Material *other)

{
  bool bVar1;
  __type _Var2;
  PbrMetallicRoughness *in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  __type _Var3;
  Value *__rhs;
  
  __rhs = in_RDI;
  bVar1 = PbrMetallicRoughness::operator==
                    (in_RSI,(PbrMetallicRoughness *)
                            CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  _Var3 = false;
  if (bVar1) {
    bVar1 = NormalTextureInfo::operator==
                      ((NormalTextureInfo *)in_RSI,
                       (NormalTextureInfo *)(ulong)in_stack_ffffffffffffffe8);
    _Var3 = false;
    if (bVar1) {
      bVar1 = OcclusionTextureInfo::operator==
                        ((OcclusionTextureInfo *)in_RSI,
                         (OcclusionTextureInfo *)(ulong)in_stack_ffffffffffffffe8);
      _Var3 = false;
      if (bVar1) {
        bVar1 = TextureInfo::operator==
                          ((TextureInfo *)in_RSI,(TextureInfo *)(ulong)in_stack_ffffffffffffffe8);
        _Var3 = false;
        if (bVar1) {
          bVar1 = Equals((vector<double,_std::allocator<double>_> *)__rhs,&in_RSI->baseColorFactor);
          _Var3 = false;
          if (bVar1) {
            _Var2 = std::operator==(unaff_retaddr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
            _Var3 = false;
            if (((_Var2) &&
                (_Var3 = false,
                ABS((double)(in_RSI->baseColorTexture).extras.binary_value_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                    (double)(in_RDI->array_value_).
                            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) < 1e-12)) &&
               (_Var3 = false,
               (*(byte *)&(in_RDI->object_value_)._M_t._M_impl & 1) ==
               (*(byte *)&(in_RSI->baseColorTexture).extras.binary_value_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 1))) {
              bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                                       *)in_RDI,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                                       *)in_stack_ffffffffffffffd8);
              _Var3 = false;
              if (bVar1) {
                bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
                _Var3 = false;
                if (bVar1) {
                  bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
                                           *)in_RDI,
                                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
                                           *)in_stack_ffffffffffffffd8);
                  _Var3 = false;
                  if (bVar1) {
                    bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
                                             *)in_RDI,
                                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
                                             *)in_stack_ffffffffffffffd8);
                    _Var3 = false;
                    if (bVar1) {
                      _Var3 = std::operator==(unaff_retaddr,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__rhs);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _Var3;
}

Assistant:

bool Material::operator==(const Material &other) const {
  return (this->pbrMetallicRoughness == other.pbrMetallicRoughness) &&
         (this->normalTexture == other.normalTexture) &&
         (this->occlusionTexture == other.occlusionTexture) &&
         (this->emissiveTexture == other.emissiveTexture) &&
         Equals(this->emissiveFactor, other.emissiveFactor) &&
         (this->alphaMode == other.alphaMode) &&
         TINYGLTF_DOUBLE_EQUAL(this->alphaCutoff, other.alphaCutoff) &&
         (this->doubleSided == other.doubleSided) &&
         (this->extensions == other.extensions) &&
         (this->extras == other.extras) && (this->values == other.values) &&
         (this->additionalValues == other.additionalValues) &&
         (this->name == other.name);
}